

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins.c
# Opt level: O0

void nn_ins_connect(nn_ins_item *item,nn_ins_fn fn)

{
  int iVar1;
  nn_list_item *pnVar2;
  char *__s2;
  code *in_RSI;
  long in_RDI;
  nn_ins_item *bitem;
  nn_list_item *it;
  nn_ep *in_stack_ffffffffffffffb8;
  nn_ep *in_stack_ffffffffffffffc0;
  nn_list_item *in_stack_ffffffffffffffc8;
  nn_list *in_stack_ffffffffffffffd0;
  nn_list_item *pnVar3;
  nn_list_item *local_18;
  
  nn_mutex_lock((nn_mutex_t *)in_stack_ffffffffffffffc0);
  nn_list_end(&self.connected);
  nn_list_insert(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (nn_list_item *)in_stack_ffffffffffffffc0);
  local_18 = nn_list_begin(&self.bound);
  do {
    pnVar3 = local_18;
    pnVar2 = nn_list_end(&self.bound);
    if (pnVar3 == pnVar2) {
LAB_0014439d:
      nn_mutex_unlock((nn_mutex_t *)in_stack_ffffffffffffffc0);
      return;
    }
    if (local_18 == (nn_list_item *)0x0) {
      local_18 = (nn_list_item *)0x0;
    }
    in_stack_ffffffffffffffc0 = (nn_ep *)nn_ep_getaddr(*(nn_ep **)(in_RDI + 0x10));
    __s2 = nn_ep_getaddr((nn_ep *)local_18[1].next);
    iVar1 = strncmp((char *)in_stack_ffffffffffffffc0,__s2,0x80);
    if (iVar1 == 0) {
      iVar1 = nn_ep_ispeer_ep(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (iVar1 != 0) {
        (*in_RSI)(in_RDI,local_18);
      }
      goto LAB_0014439d;
    }
    local_18 = nn_list_next((nn_list *)in_stack_ffffffffffffffc0,
                            (nn_list_item *)in_stack_ffffffffffffffb8);
  } while( true );
}

Assistant:

void nn_ins_connect (struct nn_ins_item *item, nn_ins_fn fn)
{
    struct nn_list_item *it;
    struct nn_ins_item *bitem;

    nn_mutex_lock (&self.sync);

    /*  Insert the entry into the endpoint repository. */
    nn_list_insert (&self.connected, &item->item,
        nn_list_end (&self.connected));

    /*  During this process a pipe may be created. */
    for (it = nn_list_begin (&self.bound);
          it != nn_list_end (&self.bound);
          it = nn_list_next (&self.bound, it)) {
        bitem = nn_cont (it, struct nn_ins_item, item);

        if (strncmp (nn_ep_getaddr(item->ep), nn_ep_getaddr(bitem->ep),
            NN_SOCKADDR_MAX) == 0) {

            /*  Check whether the two sockets are compatible. */
            if (!nn_ep_ispeer_ep (item->ep, bitem->ep))
                break;

            /*  Call back to cinproc to create actual connection. */
            fn (item, bitem);

            break;
        }
    }

    nn_mutex_unlock (&self.sync);
}